

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O0

void __thiscall Timidity::Renderer::adjust_volume(Renderer *this,int chan)

{
  int iVar1;
  int local_18;
  int i;
  int chan_local;
  Renderer *this_local;
  
  local_18 = this->voices;
  while (iVar1 = local_18 + -1, local_18 != 0) {
    local_18 = iVar1;
    if (((uint)this->voice[iVar1].channel == chan) && ((this->voice[iVar1].status & 1) != 0)) {
      recompute_amp(this,this->voice + iVar1);
      apply_envelope_to_amp(this->voice + iVar1);
    }
  }
  return;
}

Assistant:

void Renderer::adjust_volume(int chan)
{
	int i = voices;
	while (i--)
	{
		if (voice[i].channel == chan && (voice[i].status & VOICE_RUNNING))
		{
			recompute_amp(&voice[i]);
			apply_envelope_to_amp(&voice[i]);
		}
	}
}